

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (Array<double,__1,__1,_0,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  double dVar2;
  ulong cols;
  ulong uVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  
  dVar2 = (src->m_functor).m_other;
  uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
  uVar8 = (src->m_rows).m_value;
  cols = (src->m_cols).m_value;
  if (((dst->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar8) ||
     ((dst->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    if ((long)(cols | uVar8) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Array<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Array<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar8 != 0) &&
       (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar5 / SEXT816((long)cols),0) < (long)uVar8)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar5 % SEXT816((long)cols),0));
      *puVar7 = operator_new;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar8,uVar8,cols);
  }
  uVar3 = (dst->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar3 == uVar8) &&
     (uVar8 = (dst->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar8 == cols)) {
    pdVar4 = (dst->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    lVar6 = uVar8 * uVar3;
    uVar8 = lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar6) {
      lVar9 = 0;
      do {
        pdVar1 = pdVar4 + lVar9;
        *(int *)pdVar1 = SUB84(dVar2,0);
        *(undefined4 *)((long)pdVar1 + 4) = uVar10;
        *(int *)(pdVar1 + 1) = SUB84(dVar2,0);
        *(undefined4 *)((long)pdVar1 + 0xc) = uVar10;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar8);
    }
    if ((long)uVar8 < lVar6) {
      do {
        pdVar4[uVar8] = dVar2;
        uVar8 = uVar8 + 1;
      } while (lVar6 - uVar8 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Array<double, -1, -1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}